

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.hpp
# Opt level: O1

Publication * __thiscall helics::Publication::operator=(Publication *this,Publication *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  bool bVar11;
  bool bVar12;
  undefined2 uVar13;
  anon_class_8_1_8991fb9c_conflict local_18;
  
  (this->super_Interface).handle.hid = (param_1->super_Interface).handle.hid;
  (this->super_Interface).mCore = (param_1->super_Interface).mCore;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_Interface).mName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(param_1->super_Interface).mName);
  uVar1 = *(undefined4 *)&param_1->fed;
  uVar2 = *(undefined4 *)((long)&param_1->fed + 4);
  iVar3 = param_1->referenceIndex;
  uVar4 = *(undefined4 *)&param_1->field_0x44;
  uVar5 = *(undefined4 *)&param_1->dataReference;
  uVar6 = *(undefined4 *)((long)&param_1->dataReference + 4);
  uVar7 = *(undefined4 *)&param_1->delta;
  uVar8 = *(undefined4 *)((long)&param_1->delta + 4);
  bVar11 = param_1->changeDetectionEnabled;
  bVar12 = param_1->disableAssign;
  uVar13 = *(undefined2 *)&param_1->field_0x5e;
  sVar10 = param_1->customTypeHash;
  uVar9 = *(undefined4 *)((long)&param_1->customTypeHash + 4);
  this->pubType = param_1->pubType;
  this->changeDetectionEnabled = bVar11;
  this->disableAssign = bVar12;
  *(undefined2 *)&this->field_0x5e = uVar13;
  *(int *)&this->customTypeHash = (int)sVar10;
  *(undefined4 *)((long)&this->customTypeHash + 4) = uVar9;
  *(undefined4 *)&this->dataReference = uVar5;
  *(undefined4 *)((long)&this->dataReference + 4) = uVar6;
  *(undefined4 *)&this->delta = uVar7;
  *(undefined4 *)((long)&this->delta + 4) = uVar8;
  *(undefined4 *)&this->fed = uVar1;
  *(undefined4 *)((long)&this->fed + 4) = uVar2;
  this->referenceIndex = iVar3;
  *(undefined4 *)&this->field_0x44 = uVar4;
  local_18.this =
       (_Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        *)&this->prevValue;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
    ::_S_vtable._M_arr
    [(long)(char)*(__index_type *)
                  ((long)&(param_1->prevValue).
                          super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          .
                          super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                          .
                          super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                          .
                          super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                          .
                          super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                          .
                          super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                  + 0x28) + 1]._M_data)(&local_18,&param_1->prevValue);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->pubUnits,&param_1->pubUnits);
  (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->pubUnitType).
              super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(param_1->pubUnitType).
              super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return this;
}

Assistant:

class HELICS_CXX_EXPORT Publication: public Interface {
  protected:
    ValueFederate* fed{nullptr};  //!< the federate construct to interact with
  private:
    int referenceIndex{-1};  //!< an index used for callback lookup
    void* dataReference{nullptr};  //!< pointer to a piece of containing data
    double delta{-1.0};  //!< the minimum change to publish
  protected:
    DataType pubType{DataType::HELICS_ANY};  //!< the type of publication
    bool changeDetectionEnabled{false};  //!< the change detection is enabled
    bool disableAssign{false};  //!< disable assignment for the object
  private:
    size_t customTypeHash{
        0};  //!< a hash code for the custom type = 0; //!< store a hash code for a custom type
    mutable defV prevValue;  //!< the previous value of the publication
    std::string pubUnits;  //!< the defined units of the publication
    std::shared_ptr<units::precise_unit>
        pubUnitType;  //!< a unit representation of the publication unit Type;
  public:
    Publication() = default;
    /** constructor for a publication used by the valueFederateManager
    @param valueFed a pointer the link valueFederate
    @param id the InterfaceHandle from the core
    @param key the identifier for the publication
    @param type the type of the publication
    @param units an optional string defining the units*/
    Publication(ValueFederate* valueFed,
                InterfaceHandle id,
                std::string_view key,
                std::string_view type,
                std::string_view units);

    /** constructor for a publication
  @param valueFed a pointer the link valueFederate
  @param key the identifier for the publication
  @param type the type of the publication
  @param units an optional string defining the units*/
    Publication(ValueFederate* valueFed,
                std::string_view key,
                std::string_view type,
                std::string_view units = std::string_view{});

    /** base constructor for a publication
    @param valueFed a pointer of some kind to a value federate (any dereferenceable type with * and
    -> operator that results in a valueFederate object
    @param key the identifier for the publication
    @param type the type of the publication
    @param units an optional string defining the units*/
    template<class FedPtr>
    Publication(FedPtr valueFed,
                std::string_view key,
                std::string_view type = std::string_view(),
                std::string_view units = std::string_view()):
        Publication(std::addressof(*valueFed), key, type, units)
    {
        static_assert(
            std::is_base_of<ValueFederate, std::remove_reference_t<decltype(*valueFed)>>::value,
            "first argument must be a pointer to a ValueFederate");
    }
    /** base constructor for a publication
    @param locality either GLOBAL or LOCAL, LOCAL prepends the federate name to create a global
    identifier
    @param valueFed a pointer to a value federate
    @param key the identifier for the publication
    @param type the type of the publication
    @param units an optional string defining the units*/
    Publication(InterfaceVisibility locality,
                ValueFederate* valueFed,
                std::string_view key,
                std::string_view type,
                std::string_view units = std::string_view());
    /** base constructor for a publication
    @param locality either GLOBAL or LOCAL, LOCAL prepends the federate name to create a global
    identifier
    @param valueFed a pointer of some kind to a value federate (any dereferenceable type with * and
    -> operator that results in a valueFederate object
    @param key the identifier for the publication
    @param type the type of the publication
    @param units an optional string defining the units*/
    template<class FedPtr>
    Publication(InterfaceVisibility locality,
                FedPtr& valueFed,
                std::string_view key,
                std::string_view type,
                std::string_view units = std::string_view()):
        Publication(locality, std::addressof(*valueFed), key, type, units)
    {
        static_assert(
            std::is_base_of<ValueFederate, std::remove_reference_t<decltype(*valueFed)>>::value,
            "first argument must be a pointer to a ValueFederate");
    }

    /**constructor to build a publication object
  @param valueFed  the ValueFederate to use
  @param key the identifier for the publication
  @param type the defined type of the publication
  @param units the units associated with a Federate
  */
    Publication(ValueFederate* valueFed,
                std::string_view key,
                DataType type,
                std::string_view units = std::string_view()):
        Publication(valueFed, key, typeNameStringRef(type), units)
    {
    }
    /**constructor to build a publication object
    @param valueFed  the ValueFederate to use
    @param key the identifier for the publication
    @param type the defined type of the publication
    @param units the units associated with a Federate
    */
    template<class FedPtr>
    Publication(FedPtr& valueFed,
                std::string_view key,
                DataType type,
                std::string_view units = std::string_view()):
        Publication(valueFed, key, typeNameStringRef(type), units)
    {
    }
    /**constructor to build a publication object
    @param locality  set to global for a global publication or local for a local one
    @param valueFed  the ValueFederate to use
    @param key the identifier for the publication
    @param type the defined type of the publication
    @param units the units associated with a Federate
    */
    Publication(InterfaceVisibility locality,
                ValueFederate* valueFed,
                std::string_view key,
                DataType type,
                std::string_view units = std::string_view()):
        Publication(locality, valueFed, key, typeNameStringRef(type), units)
    {
    }

    /**constructor to build a publication object
    @param locality  set to global for a global publication or local for a local one
    @param valueFed  the ValueFederate to use
    @param key the identifier for the publication
    @param type the defined type of the publication
    @param units the units associated with a Federate
    */
    template<class FedPtr>
    Publication(InterfaceVisibility locality,
                FedPtr& valueFed,
                std::string_view key,
                DataType type,
                std::string_view units = std::string_view()):
        Publication(locality, valueFed, key, typeNameStringRef(type), units)
    {
    }

    /** get the type for the publication*/
    const std::string& getType() const { return getExtractionType(); }
    /** get the units of the publication*/
    const std::string& getUnits() const { return pubUnits; }
    /** add an input object to target*/
    void addTarget(std::string_view target) { addDestinationTarget(target); }
    /** add an input object to send the information*/
    void addInputTarget(std::string_view target) { addDestinationTarget(target); }
    /** close a input during an active simulation
    @details it is not necessary to call this function unless you are continuing the simulation
    after the close*/

    /** send a value for publication
    @param val the value to publish*/
    void publish(double val);
    void publish(const std::vector<std::string>& val);
    void publish(const std::vector<double>& val);
    void publish(const double* vals, int size);
    void publish(const std::vector<std::complex<double>>& val);
    /** interpret as a vector of alternating real and imag values*/
    void publishComplex(const double* vals, int size);
    void publish(std::complex<double> val);

    void publish(bool val);
    void publish(Time val);
    void publish(char val);
    void publish(const NamedPoint& np);
    void publish(std::string_view field, double val);
    /** secondary publish function to allow unit conversion before publication
    @param val the value to publish
    @param units  the units association with the publication
    */

    void publish(double val, const std::string& units);
    void publish(double val, const units::precise_unit& units);

    /** publish stringLike values */
    template<class X>
    std::enable_if_t<(std::is_constructible_v<std::string_view, X>), void> publish(const X& val)
    {
        publishString(val);
    }

    /** publish stringLike values */
    template<class X>
    std::enable_if_t<(std::is_same_v<defV, remove_cv_ref<X>>), void> publish(const X& val)
    {
        publishDefV(val);
    }

    /** publish integral values */
    template<class X>
    std::enable_if_t<(std::is_integral_v<X> && !std::is_same_v<remove_cv_ref<X>, char>), void>
        publish(X val)
    {
        publishInt(static_cast<int64_t>(val));
    }

    /** set the level by which a value must have changed to actually publish the value
     */
    void setMinimumChange(double deltaV) noexcept
    {
        if (delta < 0.0) {
            changeDetectionEnabled = true;
        }
        delta = deltaV;
        if (delta < 0.0) {
            changeDetectionEnabled = false;
        }
    }
    /** if set to false, the change detection mechanisms are not enabled
    if set to true the values will be published if there is sufficient change as specified in
    the call to setMinimumChange
    */
    void enableChangeDetection(bool enabled = true) noexcept { changeDetectionEnabled = enabled; }

    virtual const std::string& getDisplayName() const override { return getName(); }

  private:
    /** implementation of the integer publications
    @details this is the same as the other publish function but is used in the template due to
    template overload resolution rules I wanted to be able to call this inside a template which took
    all Int types and without this it would be recursive
    */
    void publishInt(int64_t val);
    void publishString(std::string_view val);
    void publishDefV(const defV& val);
    friend class ValueFederateManager;
}